

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O2

string_type * __thiscall
toml::detail::serializer<toml::type_config>::format_indent_abi_cxx11_
          (string_type *__return_storage_ptr__,serializer<toml::type_config> *this,
          indent_char indent_type)

{
  char in_CL;
  int iVar1;
  undefined7 in_register_00000011;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_00;
  detail *this_00;
  string *this_01;
  string local_50;
  string local_30;
  
  this_00 = (detail *)0x0;
  if (0 < this->current_indent_) {
    this_00 = (detail *)(ulong)(uint)this->current_indent_;
  }
  iVar1 = (int)CONCAT71(in_register_00000011,indent_type);
  if (iVar1 == 1) {
    make_string_abi_cxx11_(&local_50,this_00,9,in_CL);
    string_conv<std::__cxx11::string,char,std::char_traits<char>,std::allocator<char>>
              (__return_storage_ptr__,(detail *)&local_50,s_00);
    this_01 = &local_50;
  }
  else {
    if (iVar1 != 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      return __return_storage_ptr__;
    }
    make_string_abi_cxx11_(&local_30,this_00,0x20,in_CL);
    string_conv<std::__cxx11::string,char,std::char_traits<char>,std::allocator<char>>
              (__return_storage_ptr__,(detail *)&local_30,s);
    this_01 = &local_30;
  }
  std::__cxx11::string::~string((string *)this_01);
  return __return_storage_ptr__;
}

Assistant:

string_type format_indent(const indent_char indent_type) const // {{{
    {
        const auto indent = static_cast<std::size_t>((std::max)(0, this->current_indent_));
        if(indent_type == indent_char::space)
        {
            return string_conv<string_type>(make_string(indent, ' '));
        }
        else if(indent_type == indent_char::tab)
        {
            return string_conv<string_type>(make_string(indent, '\t'));
        }
        else
        {
            return string_type{};
        }
    }